

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

bool isValidHttpHeaderNameField(QAnyStringView name)

{
  bool bVar1;
  byte bVar2;
  QAnyStringView *in_RDI;
  long in_FS_OFFSET;
  bool valid;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  QMessageLogger *in_stack_ffffffffffffff90;
  char local_58 [24];
  anon_class_1_0_00000001 *in_stack_ffffffffffffffc0;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QAnyStringView::isEmpty((QAnyStringView *)0x1c6a1c);
  if (bVar1) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcQHttpHeaders();
    anon_unknown.dwarf_1a98d9::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (QLoggingCategory *)
               CONCAT17(in_stack_ffffffffffffff7f,
                        CONCAT16(in_stack_ffffffffffffff7e,
                                 CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78))));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_1a98d9::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1c6a66);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 (char *)CONCAT17(in_stack_ffffffffffffff7f,
                                  CONCAT16(in_stack_ffffffffffffff7e,
                                           CONCAT15(in_stack_ffffffffffffff7d,
                                                    in_stack_ffffffffffffff78))),(char *)0x1c6a7c);
      QMessageLogger::warning(local_58,"HTTP header name cannot be empty");
      local_10 = local_10 & 0xffffffffffffff00;
    }
    bVar1 = false;
  }
  else {
    bVar2 = QAnyStringView::visit<isValidHttpHeaderNameField(QAnyStringView)::__0>
                      (in_RDI,in_stack_ffffffffffffffc0);
    if (!(bool)bVar2) {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      lcQHttpHeaders();
      anon_unknown.dwarf_1a98d9::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (QLoggingCategory *)
                 CONCAT17(in_stack_ffffffffffffff7f,
                          CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffff7d,
                                                  in_stack_ffffffffffffff78))));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_1a98d9::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1c6b00);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                   (char *)CONCAT17(in_stack_ffffffffffffff7f,
                                    CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffff7d,
                                                            in_stack_ffffffffffffff78))),
                   (char *)0x1c6b16);
        QMessageLogger::warning
                  (&stack0xffffffffffffff80,"HTTP header name contained illegal character(s)");
        local_20 = local_20 & 0xffffffffffffff00;
      }
    }
    bVar1 = (bool)(bVar2 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool isValidHttpHeaderNameField(QAnyStringView name) noexcept
{
    if (name.isEmpty()) {
        qCWarning(lcQHttpHeaders, "HTTP header name cannot be empty");
        return false;
    }
    const bool valid = name.visit([](auto name){ return headerNameValidImpl(name); });
    if (!valid)
        qCWarning(lcQHttpHeaders, "HTTP header name contained illegal character(s)");
    return valid;
}